

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::NormalizeFindResult(cmFindBase *this)

{
  cmValue *this_00;
  cmMakefile *pcVar1;
  string_view value_00;
  bool bVar2;
  PolicyStatus PVar3;
  ulong uVar4;
  string *psVar5;
  cmake *pcVar6;
  cmValue local_1b0;
  string_view local_1a8;
  allocator<char> local_191;
  string local_190;
  string_view local_170;
  string_view local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  cmCMakePath local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  cmCMakePath local_d8;
  cmCMakePath local_b0;
  cmCMakePath local_88;
  string local_60;
  undefined1 local_40 [8];
  string value;
  cmValue *existingValue;
  cmFindBase *this_local;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  if (PVar3 == NEW) {
    value.field_2._8_8_ =
         cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,&this->VariableName);
    this_00 = (cmValue *)(&value.field_2._M_allocated_capacity + 1);
    std::__cxx11::string::string((string *)local_40);
    cmValue::operator->[abi_cxx11_(this_00);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      psVar5 = cmValue::operator*[abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)&local_f8,(string *)psVar5);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&local_d8,&local_f8,auto_format);
      pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
      psVar5 = cmake::GetCMakeWorkingDirectory_abi_cxx11_(pcVar6);
      std::__cxx11::string::string((string *)&local_150,(string *)psVar5);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                (&local_130,&local_150,generic_format);
      cmCMakePath::Absolute(&local_b0,&local_d8,&local_130);
      cmCMakePath::Normal(&local_88,&local_b0);
      cmCMakePath::GenericString_abi_cxx11_(&local_60,&local_88);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      cmCMakePath::~cmCMakePath(&local_88);
      cmCMakePath::~cmCMakePath(&local_b0);
      cmCMakePath::~cmCMakePath(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      cmCMakePath::~cmCMakePath(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      bVar2 = cmsys::SystemTools::FileExists((string *)local_40,false);
      if (!bVar2) {
        psVar5 = cmValue::operator*[abi_cxx11_(this_00);
        std::__cxx11::string::operator=((string *)local_40,(string *)psVar5);
      }
    }
    if ((this->StoreResultInCache & 1U) == 0) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      local_170 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_170);
    }
    else {
      psVar5 = cmValue::operator*[abi_cxx11_(this_00);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,psVar5);
      if ((bVar2) || ((this->AlreadyInCacheWithoutMetaInfo & 1U) != 0)) {
        pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
        cmake::AddCacheEntry
                  (pcVar6,&this->VariableName,(string *)local_40,&this->VariableDocumentation,
                   this->VariableType);
        PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
        if (PVar3 == NEW) {
          bVar2 = cmMakefile::IsNormalDefinitionSet
                            ((this->super_cmFindCommon).Makefile,&this->VariableName);
          if (bVar2) {
            pcVar1 = (this->super_cmFindCommon).Makefile;
            local_160 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40)
            ;
            cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_160);
          }
        }
        else {
          cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&this->VariableName);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else if ((this->StoreResultInCache & 1U) == 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    psVar5 = cmMakefile::GetSafeDefinition((this->super_cmFindCommon).Makefile,&this->VariableName);
    value_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    cmMakefile::AddDefinition(pcVar1,&this->VariableName,value_00);
  }
  else if ((this->AlreadyInCacheWithoutMetaInfo & 1U) != 0) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->VariableName,&local_190,&this->VariableDocumentation,this->VariableType
               ,false);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    if ((PVar3 == NEW) &&
       (bVar2 = cmMakefile::IsNormalDefinitionSet
                          ((this->super_cmFindCommon).Makefile,&this->VariableName), bVar2)) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      pcVar6 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
      local_1b0 = cmake::GetCacheDefinition(pcVar6,&this->VariableName);
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1b0);
      local_1a8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      cmMakefile::AddDefinition(pcVar1,&this->VariableName,local_1a8);
    }
  }
  return;
}

Assistant:

void cmFindBase::NormalizeFindResult()
{
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) ==
      cmPolicies::NEW) {
    // ensure the path returned by find_* command is absolute
    const auto& existingValue =
      this->Makefile->GetDefinition(this->VariableName);
    std::string value;
    if (!existingValue->empty()) {
      value =
        cmCMakePath(*existingValue, cmCMakePath::auto_format)
          .Absolute(cmCMakePath(
            this->Makefile->GetCMakeInstance()->GetCMakeWorkingDirectory()))
          .Normal()
          .GenericString();
      // value = cmSystemTools::CollapseFullPath(*existingValue);
      if (!cmSystemTools::FileExists(value, false)) {
        value = *existingValue;
      }
    }

    if (this->StoreResultInCache) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the original
      // value.
      if (value != *existingValue || this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->GetCMakeInstance()->AddCacheEntry(
          this->VariableName, value, this->VariableDocumentation,
          this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
            cmPolicies::NEW) {
          if (this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
            this->Makefile->AddDefinition(this->VariableName, value);
          }
        } else {
          // if there was a definition then remove it
          // This is required to ensure same behavior as
          // cmMakefile::AddCacheDefinition.
          this->Makefile->RemoveDefinition(this->VariableName);
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(this->VariableName, value);
    }
  } else {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->StoreResultInCache) {
      if (this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->AddCacheDefinition(this->VariableName, "",
                                           this->VariableDocumentation,
                                           this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
              cmPolicies::NEW &&
            this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
          this->Makefile->AddDefinition(
            this->VariableName,
            *this->Makefile->GetCMakeInstance()->GetCacheDefinition(
              this->VariableName));
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(
        this->VariableName,
        this->Makefile->GetSafeDefinition(this->VariableName));
    }
  }
}